

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O2

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1,_2,_0,_1>
     ::run(Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false> *lhs,
          Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false> *rhs)

{
  size_t size;
  float *_lhs;
  long size_00;
  long lhsStride;
  float *rhs_00;
  float *pfVar1;
  float afStack_38 [2];
  undefined1 local_30 [8];
  aligned_stack_memory_handler<float> actualRhs_stack_memory_destructor;
  
  actualRhs_stack_memory_destructor.m_ptr =
       (float *)(rhs->
                super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
                super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
                m_rows.m_value;
  if ((ulong)actualRhs_stack_memory_destructor.m_ptr >> 0x3e != 0) {
    throw_std_bad_alloc();
    actualRhs_stack_memory_destructor.m_ptr =
         (float *)(rhs->
                  super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                  ).super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                  .m_rows.m_value;
  }
  rhs_00 = (rhs->super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>)
           .super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           m_data;
  if (rhs_00 == (float *)0x0) {
    size = (long)actualRhs_stack_memory_destructor.m_ptr * 4;
    if (size < 0x20001) {
      rhs_00 = (float *)((long)afStack_38 - (size + 0x1e & 0xfffffffffffffff0));
      local_30 = (undefined1  [8])rhs_00;
      pfVar1 = rhs_00;
    }
    else {
      rhs_00 = (float *)aligned_malloc(size);
      actualRhs_stack_memory_destructor.m_ptr =
           (float *)(rhs->
                    super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                    .m_rows.m_value;
      local_30 = (undefined1  [8])(float *)0x0;
      pfVar1 = afStack_38;
      if ((rhs->super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data
          == (PointerType)0x0) {
        local_30 = (undefined1  [8])rhs_00;
        pfVar1 = afStack_38;
      }
    }
  }
  else {
    local_30 = (undefined1  [8])(float *)0x0;
    pfVar1 = afStack_38;
  }
  actualRhs_stack_memory_destructor.m_size._0_1_ =
       0x20000 < (ulong)((long)actualRhs_stack_memory_destructor.m_ptr * 4);
  _lhs = (lhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_0>.
         m_data;
  size_00 = (lhs->
            super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_0>
            .m_cols.m_value;
  lhsStride = (((lhs->
                super_BlockImpl<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>
               .m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>).m_storage.
              m_rows;
  pfVar1[-2] = 1.945567e-39;
  pfVar1[-1] = 0.0;
  triangular_solve_vector<float,_float,_long,_1,_2,_false,_0>::run(size_00,_lhs,lhsStride,rhs_00);
  pfVar1[-2] = 1.94558e-39;
  pfVar1[-1] = 0.0;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_30);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC void run(const Lhs& lhs, Rhs& rhs)
  {
    ActualLhsType actualLhs = LhsProductTraits::extract(lhs);

    // FIXME find a way to allow an inner stride if packet_traits<Scalar>::size==1

    bool useRhsDirectly = Rhs::InnerStrideAtCompileTime==1 || rhs.innerStride()==1;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhs,rhs.size(),
                                                  (useRhsDirectly ? rhs.data() : 0));

    if(!useRhsDirectly)
      MappedRhs(actualRhs,rhs.size()) = rhs;

    triangular_solve_vector<LhsScalar, RhsScalar, Index, Side, Mode, LhsProductTraits::NeedToConjugate,
                            (int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor>
      ::run(actualLhs.cols(), actualLhs.data(), actualLhs.outerStride(), actualRhs);

    if(!useRhsDirectly)
      rhs = MappedRhs(actualRhs, rhs.size());
  }